

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int ly_set_merge(ly_set *trg,ly_set *src,int options)

{
  int iVar1;
  lys_node **pplVar2;
  void **new;
  uint local_28;
  uint ret;
  uint i;
  int options_local;
  ly_set *src_local;
  ly_set *trg_local;
  
  if (trg == (ly_set *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","ly_set_merge");
    trg_local._4_4_ = 0xffffffff;
  }
  else if (src == (ly_set *)0x0) {
    trg_local._4_4_ = 0;
  }
  else {
    if ((options & 1U) == 0) {
      local_28 = 0;
      while (local_28 < src->number) {
        iVar1 = ly_set_contains(trg,(src->set).s[local_28]);
        if (iVar1 < 0) {
          local_28 = local_28 + 1;
        }
        else {
          ly_set_rm_index(src,local_28);
        }
      }
    }
    if (trg->size < trg->number + src->number) {
      pplVar2 = (lys_node **)realloc((trg->set).s,(ulong)(trg->number + src->number) << 3);
      if (pplVar2 == (lys_node **)0x0) {
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_set_merge");
        return -1;
      }
      trg->size = trg->number + src->number;
      (trg->set).s = pplVar2;
    }
    memcpy((trg->set).s + trg->number,(src->set).s,(ulong)src->number << 3);
    trg_local._4_4_ = src->number;
    trg->number = trg_local._4_4_ + trg->number;
    ly_set_free(src);
  }
  return trg_local._4_4_;
}

Assistant:

API int
ly_set_merge(struct ly_set *trg, struct ly_set *src, int options)
{
    unsigned int i, ret;
    void **new;

    if (!trg) {
        LOGARG;
        return -1;
    }

    if (!src) {
        return 0;
    }

    if (!(options & LY_SET_OPT_USEASLIST)) {
        /* remove duplicates */
        i = 0;
        while (i < src->number) {
            if (ly_set_contains(trg, src->set.g[i]) > -1) {
                ly_set_rm_index(src, i);
            } else {
                ++i;
            }
        }
    }

    /* allocate more memory if needed */
    if (trg->size < trg->number + src->number) {
        new = realloc(trg->set.g, (trg->number + src->number) * sizeof *(trg->set.g));
        LY_CHECK_ERR_RETURN(!new, LOGMEM(NULL), -1);
        trg->size = trg->number + src->number;
        trg->set.g = new;
    }

    /* copy contents from src into trg */
    memcpy(trg->set.g + trg->number, src->set.g, src->number * sizeof *(src->set.g));
    ret = src->number;
    trg->number += ret;

    /* cleanup */
    ly_set_free(src);
    return ret;
}